

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
::find_or_prepare_insert_soo<google::protobuf::Symbol>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          *this,Symbol *key)

{
  bool bVar1;
  slot_type *slot;
  Symbol *ts;
  size_t sVar2;
  hasher *this_00;
  CommonFields *pCVar3;
  bool local_79;
  iterator local_78;
  size_t local_68;
  size_t index;
  iterator local_58;
  EqualElement<google::protobuf::Symbol> local_48;
  bool local_31;
  iterator local_30;
  HashtablezInfoHandle local_19;
  Symbol *pSStack_18;
  HashtablezInfoHandle infoz;
  Symbol *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *this_local;
  
  pSStack_18 = key;
  bVar1 = empty(this);
  if (bVar1) {
    try_sample_soo(this);
    bVar1 = HashtablezInfoHandle::IsSampled(&local_19);
    if (!bVar1) {
      pCVar3 = common(this);
      CommonFields::set_full_soo(pCVar3);
      local_30 = soo_iterator(this);
      local_31 = true;
      std::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
      ::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool,_true>
                (__return_storage_ptr__,&local_30,&local_31);
      return __return_storage_ptr__;
    }
    resize_with_soo_infoz(this);
  }
  else {
    local_48.rhs = pSStack_18;
    local_48.eq = eq_ref(this);
    slot = soo_slot(this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                      (&local_48,ts);
    if (bVar1) {
      local_58 = soo_iterator(this);
      index._7_1_ = 0;
      std::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
      ::
      pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool,_true>
                (__return_storage_ptr__,&local_58,(bool *)((long)&index + 7));
      return __return_storage_ptr__;
    }
    sVar2 = SooCapacity();
    sVar2 = NextCapacity(sVar2);
    resize(this,sVar2);
  }
  this_00 = hash_ref(this);
  sVar2 = google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                    ((SymbolByParentHash *)this_00,pSStack_18);
  pCVar3 = common(this);
  local_68 = PrepareInsertAfterSoo(sVar2,8,pCVar3);
  local_78 = iterator_at(this,local_68);
  local_79 = true;
  std::
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool>
  ::
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>::iterator,_bool,_true>
            (__return_storage_ptr__,&local_78,&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }